

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O1

void __thiscall sfc::Palette::save_act(Palette *this,string *path)

{
  uint uVar1;
  pointer pSVar2;
  long lVar3;
  int iVar4;
  void *__s;
  int iVar5;
  undefined1 *puVar6;
  value_type *__val;
  int iVar7;
  undefined1 uVar8;
  pointer puVar9;
  undefined1 uVar10;
  long lVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  pointer this_00;
  bool bVar14;
  bool bVar15;
  rgba_vec_t colors;
  Subpalette spp;
  rgba_vec_t local_248;
  undefined1 local_230 [8];
  pointer local_228;
  pointer local_218;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_210 [4];
  ios_base local_138 [264];
  
  __s = operator_new(0x304);
  uVar13 = 0;
  memset(__s,0,0x304);
  this_00 = (this->_subpalettes).
            super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pSVar2) {
    iVar7 = 0;
    do {
      Subpalette::padded((Subpalette *)local_230,this_00);
      Subpalette::normalized_colors(&local_248,(Subpalette *)local_230);
      bVar14 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start ==
               local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar4 = iVar7;
      if (!bVar14) {
        iVar5 = 0x100;
        if (0x100 < iVar7) {
          iVar5 = iVar7;
        }
        uVar1 = *local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar15 = -1 < (int)uVar1;
        uVar12 = (char)(uVar1 >> 0x10);
        if (bVar15) {
          uVar12 = uVar13;
        }
        uVar10 = (char)(uVar1 >> 8);
        if (bVar15) {
          uVar10 = uVar13;
        }
        uVar8 = (char)uVar1;
        if (bVar15) {
          uVar8 = uVar13;
        }
        lVar3 = (long)iVar7 * 3;
        *(undefined1 *)((long)__s + lVar3) = uVar8;
        *(undefined1 *)((long)__s + lVar3 + 1) = uVar10;
        *(undefined1 *)((long)__s + lVar3 + 2) = uVar12;
        iVar4 = iVar5 + 1;
        if (iVar7 < 0x100) {
          lVar11 = (long)iVar7 + -1;
          puVar6 = (undefined1 *)((long)__s + lVar3 + 5);
          puVar9 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          do {
            iVar7 = iVar7 + 1;
            puVar9 = puVar9 + 1;
            bVar14 = puVar9 == local_248.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
            iVar4 = iVar7;
            if (bVar14) break;
            uVar1 = *puVar9;
            bVar15 = -1 < (int)uVar1;
            uVar12 = (char)(uVar1 >> 0x10);
            if (bVar15) {
              uVar12 = uVar13;
            }
            uVar10 = (char)(uVar1 >> 8);
            if (bVar15) {
              uVar10 = uVar13;
            }
            uVar8 = (char)uVar1;
            if (bVar15) {
              uVar8 = uVar13;
            }
            puVar6[-2] = uVar8;
            puVar6[-1] = uVar10;
            *puVar6 = uVar12;
            lVar11 = lVar11 + 1;
            puVar6 = puVar6 + 3;
            iVar4 = iVar5 + 1;
          } while (lVar11 < 0xff);
        }
      }
      iVar7 = iVar4;
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(local_210);
      if (local_228 != (pointer)0x0) {
        operator_delete(local_228,(long)local_218 - (long)local_228);
      }
      this_00 = this_00 + 1;
    } while ((bool)(bVar14 & this_00 != pSVar2));
    uVar13 = (undefined1)iVar7;
  }
  *(undefined1 *)((long)__s + 0x300) = 0;
  *(undefined1 *)((long)__s + 0x301) = uVar13;
  *(undefined2 *)((long)__s + 0x302) = 0xffff;
  std::ofstream::ofstream(local_230,(string *)path,_S_trunc|_S_out|_S_bin);
  std::ostream::write(local_230,(long)__s);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  operator_delete(__s,0x304);
  return;
}

Assistant:

void Palette::save_act(const std::string& path) const {
  byte_vec_t data((256 * 3) + 4);
  int count = 0;

  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    rgba_vec_t colors = spp.normalized_colors();
    for (const auto& c : colors) {
      rgba_color rgba(c);
      data[count * 3 + 0] = rgba.r;
      data[count * 3 + 1] = rgba.g;
      data[count * 3 + 2] = rgba.b;
      if (++count > 256)
        goto done;
    }
  }

done:
  data[0x300] = 0x00;
  data[0x301] = count & 0xff;
  data[0x302] = data[0x303] = 0xff;
  write_file(path, data);
}